

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O3

char * rnndec_decodeval(rnndeccontext *ctx,rnntypeinfo *ti,uint64_t value,int width)

{
  rnnbitfield **pprVar1;
  rnnbitfield *prVar2;
  rnnvalue **pprVar3;
  rnnvalue *prVar4;
  envy_colors *peVar5;
  int iVar6;
  int iVar7;
  rnnbitfield ***ppprVar8;
  char *pcVar9;
  rnnvalue ***ppprVar10;
  byte bVar11;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  char **__ptr;
  int *piVar15;
  char *__fmt;
  char *pcVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  float fVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  char *res;
  char *tmp;
  char *local_50;
  char *local_48;
  ulong local_40;
  long local_38;
  
code_r0x0024dd22:
  uVar19 = value >> 0x20;
  local_50 = (char *)0x0;
  if (ti != (rnntypeinfo *)0x0) {
    iVar6 = ti->shr;
    uVar17 = value << ((byte)iVar6 & 0x3f);
    uVar19 = uVar17;
    if (iVar6 == 0) {
      uVar19 = value;
    }
    iVar7 = (int)(uVar17 >> 0x20);
    if (iVar6 == 0) {
      iVar7 = (int)(value >> 0x20);
    }
    lVar12 = (long)ti->add;
    uVar17 = (uVar19 & 0xffffffff) + lVar12;
    uVar14 = uVar17;
    if (lVar12 == 0) {
      uVar14 = uVar19;
    }
    value = uVar14 & 0xffffffff;
    iVar6 = (int)(uVar17 >> 0x20);
    if (lVar12 == 0) {
      iVar6 = 0;
    }
    uVar19 = (ulong)(uint)(iVar6 + iVar7);
    bVar11 = (byte)width;
    switch(ti->type) {
    case RNN_TTYPE_INLINE_ENUM:
      ppprVar10 = &ti->vals;
      piVar15 = &ti->valsnum;
      break;
    case RNN_TTYPE_INLINE_BITSET:
      ppprVar8 = &ti->bitfields;
      piVar15 = &ti->bitfieldsnum;
      goto LAB_0024de47;
    case RNN_TTYPE_ENUM:
      ppprVar10 = &ti->eenum->vals;
      piVar15 = &ti->eenum->valsnum;
      break;
    case RNN_TTYPE_BITSET:
      ppprVar8 = &ti->ebitset->bitfields;
      piVar15 = &ti->ebitset->bitfieldsnum;
LAB_0024de47:
      lVar12 = (long)*piVar15;
      uVar19 = value | uVar19 << 0x20;
      if (lVar12 < 1) {
        if (uVar19 == 0) goto LAB_0024e24b;
        goto LAB_0024e21f;
      }
      pprVar1 = *ppprVar8;
      lVar18 = 0;
      uVar17 = 0;
      local_38 = lVar12;
      goto LAB_0024de6d;
    case RNN_TTYPE_SPECTYPE:
      goto switchD_0024dda6_caseD_4;
    default:
      goto switchD_0024dda6_caseD_5;
    case RNN_TTYPE_INT:
      uVar19 = value | uVar19 << 0x20;
      peVar5 = ctx->colors;
      if ((uVar19 >> ((ulong)(byte)(bVar11 - 1) & 0x3f) & 1) == 0) {
        pcVar9 = peVar5->reset;
        pcVar16 = "%s%li%s";
      }
      else {
        uVar19 = (1L << (bVar11 & 0x3f)) - uVar19;
        pcVar9 = peVar5->reset;
        pcVar16 = "%s-%li%s";
      }
      asprintf(&local_50,pcVar16,peVar5->num,uVar19,pcVar9);
      return local_50;
    case RNN_TTYPE_UINT:
      pcVar9 = ctx->colors->reset;
      pcVar16 = ctx->colors->num;
      pcVar13 = (char *)(value | uVar19 << 0x20);
      __fmt = "%s%lu%s";
      goto LAB_0024e09e;
    case RNN_TTYPE_FLOAT:
switchD_0024dda6_caseD_8:
      if (width == 0x10) {
        peVar5 = ctx->colors;
        pcVar9 = peVar5->num;
        fVar20 = float16((uint16_t)value);
        dVar21 = (double)fVar20;
        pcVar16 = peVar5->reset;
      }
      else if (width == 0x20) {
        pcVar16 = ctx->colors->reset;
        pcVar9 = ctx->colors->num;
        dVar21 = (double)(float)uVar14;
      }
      else {
        if (width != 0x40) goto switchD_0024dda6_caseD_5;
        pcVar16 = ctx->colors->reset;
        pcVar9 = ctx->colors->num;
        dVar21 = (double)(value | uVar19 << 0x20);
      }
      asprintf(&local_50,"%s%f%s",dVar21,pcVar9,pcVar16);
      return local_50;
    case RNN_TTYPE_BOOLEAN:
      uVar17 = value | uVar19 << 0x20;
      if (uVar17 == 1) {
        pcVar9 = ctx->colors->reset;
        pcVar16 = ctx->colors->eval;
        pcVar13 = "%sTRUE%s";
      }
      else {
        if (uVar17 != 0) goto switchD_0024dda6_caseD_8;
        pcVar9 = ctx->colors->reset;
        pcVar16 = ctx->colors->eval;
        pcVar13 = "%sFALSE%s";
      }
      __ptr = &local_50;
      asprintf(__ptr,pcVar13,pcVar16,pcVar9);
      goto LAB_0024e0ad;
    case RNN_TTYPE_FIXED:
      uVar19 = value | uVar19 << 0x20;
      if ((uVar19 >> ((ulong)(byte)(bVar11 - 1) & 0x3f) & 1) == 0) goto LAB_0024e1bb;
      pcVar9 = ctx->colors->reset;
      pcVar16 = ctx->colors->num;
      lVar12 = (1L << (bVar11 & 0x3f)) - uVar19;
      auVar22._8_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar22._0_8_ = lVar12;
      auVar22._12_4_ = 0x45300000;
      dVar21 = ((auVar22._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) /
               (double)(1 << ((byte)ti->radix & 0x1f));
      pcVar13 = "%s-%lf%s (%08lx)";
      goto LAB_0024e203;
    case RNN_TTYPE_UFIXED:
      uVar19 = value | uVar19 << 0x20;
LAB_0024e1bb:
      pcVar9 = ctx->colors->reset;
      pcVar16 = ctx->colors->num;
      auVar23._8_4_ = (int)(uVar19 >> 0x20);
      auVar23._0_8_ = uVar19;
      auVar23._12_4_ = 0x45300000;
      dVar21 = ((auVar23._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar19) - 4503599627370496.0)) /
               (double)(1 << ((byte)ti->radix & 0x1f));
      pcVar13 = "%s%lf%s (%08lx)";
LAB_0024e203:
      __ptr = &local_50;
      asprintf(__ptr,pcVar13,dVar21,pcVar16,pcVar9);
      goto LAB_0024e0ad;
    }
    iVar6 = *piVar15;
    if (0 < (long)iVar6) {
      pprVar3 = *ppprVar10;
      local_40 = value | uVar19 << 0x20;
      lVar12 = 0;
      goto LAB_0024e04b;
    }
  }
  goto switchD_0024dda6_caseD_5;
switchD_0024dda6_caseD_4:
  ti = &ti->spectype->typeinfo;
  value = value | uVar19 << 0x20;
  goto code_r0x0024dd22;
LAB_0024de6d:
  do {
    iVar6 = rnndec_varmatch(ctx,&pprVar1[lVar18]->varinfo);
    if (iVar6 != 0) {
      prVar2 = pprVar1[lVar18];
      uVar14 = (prVar2->mask & uVar19) >> ((byte)prVar2->low & 0x3f);
      uVar17 = uVar17 | prVar2->mask;
      if ((prVar2->typeinfo).type == RNN_TTYPE_BOOLEAN) {
        if (uVar14 != 0) {
          if (uVar14 != 1) goto LAB_0024defb;
          if (local_50 == (char *)0x0) {
            asprintf(&local_50,"%s%s%s",ctx->colors->mod,prVar2->name,ctx->colors->reset);
          }
          else {
            asprintf(&local_48,"%s | %s%s%s");
            free(local_50);
            local_50 = local_48;
          }
        }
      }
      else {
LAB_0024defb:
        local_40 = uVar17;
        pcVar9 = rnndec_decodeval(ctx,&prVar2->typeinfo,uVar14,(prVar2->high - prVar2->low) + 1);
        if (local_50 == (char *)0x0) {
          asprintf(&local_50,"%s%s%s = %s",ctx->colors->rname,pprVar1[lVar18]->name,
                   ctx->colors->reset,pcVar9);
        }
        else {
          asprintf(&local_48,"%s | %s%s%s = %s");
          free(local_50);
          local_50 = local_48;
        }
        free(pcVar9);
        uVar17 = local_40;
        lVar12 = local_38;
      }
    }
    lVar18 = lVar18 + 1;
  } while (lVar12 != lVar18);
  uVar19 = uVar19 & ~uVar17;
  if (uVar19 != 0) {
    if (local_50 == (char *)0x0) {
LAB_0024e21f:
      asprintf(&local_50,"%s%#lx%s",ctx->colors->err,uVar19,ctx->colors->reset);
    }
    else {
      asprintf(&local_48,"%s | %s%#lx%s",local_50,ctx->colors->err,uVar19,ctx->colors->reset);
      free(local_50);
      local_50 = local_48;
    }
  }
  if (local_50 == (char *)0x0) {
LAB_0024e24b:
    asprintf(&local_50,"%s0%s",ctx->colors->num,ctx->colors->reset);
  }
  __ptr = &local_48;
  asprintf(__ptr,"{ %s }",local_50);
  free(local_50);
  goto LAB_0024e0ad;
  while (lVar12 = lVar12 + 1, iVar6 != lVar12) {
LAB_0024e04b:
    iVar7 = rnndec_varmatch(ctx,&pprVar3[lVar12]->varinfo);
    if (((iVar7 != 0) && (prVar4 = pprVar3[lVar12], prVar4->valvalid != 0)) &&
       (prVar4->value == local_40)) {
      pcVar9 = ctx->colors->reset;
      pcVar16 = ctx->colors->eval;
      pcVar13 = prVar4->name;
      __fmt = "%s%s%s";
      goto LAB_0024e09e;
    }
  }
switchD_0024dda6_caseD_5:
  pcVar9 = ctx->colors->reset;
  pcVar16 = ctx->colors->num;
  pcVar13 = (char *)(value & 0xffffffff | uVar19 << 0x20);
  __fmt = "%s%#lx%s";
LAB_0024e09e:
  __ptr = &local_50;
  asprintf(__ptr,__fmt,pcVar16,pcVar13,pcVar9);
LAB_0024e0ad:
  return *__ptr;
}

Assistant:

char *rnndec_decodeval(struct rnndeccontext *ctx, struct rnntypeinfo *ti, uint64_t value, int width) {
	char *res = 0;
	int i;
	struct rnnvalue **vals;
	int valsnum;
	struct rnnbitfield **bitfields;
	int bitfieldsnum;
	char *tmp;
	uint64_t mask;
	if (!ti)
		goto failhex;
	if (ti->shr) value <<= ti->shr;
	if (ti->add) value += ti->add;
	switch (ti->type) {
		case RNN_TTYPE_ENUM:
			vals = ti->eenum->vals;
			valsnum = ti->eenum->valsnum;
			goto doenum;
		case RNN_TTYPE_INLINE_ENUM:
			vals = ti->vals;
			valsnum = ti->valsnum;
			goto doenum;
		doenum:
			for (i = 0; i < valsnum; i++)
				if (rnndec_varmatch(ctx, &vals[i]->varinfo) && vals[i]->valvalid && vals[i]->value == value) {
					asprintf (&res, "%s%s%s", ctx->colors->eval, vals[i]->name, ctx->colors->reset);
					return res;
				}
			goto failhex;
		case RNN_TTYPE_BITSET:
			bitfields = ti->ebitset->bitfields;
			bitfieldsnum = ti->ebitset->bitfieldsnum;
			goto dobitset;
		case RNN_TTYPE_INLINE_BITSET:
			bitfields = ti->bitfields;
			bitfieldsnum = ti->bitfieldsnum;
			goto dobitset;
		dobitset:
			mask = 0;
			for (i = 0; i < bitfieldsnum; i++) {
				if (!rnndec_varmatch(ctx, &bitfields[i]->varinfo))
					continue;
				uint64_t sval = (value & bitfields[i]->mask) >> bitfields[i]->low;
				mask |= bitfields[i]->mask;
				if (bitfields[i]->typeinfo.type == RNN_TTYPE_BOOLEAN) {
					if (sval == 0)
						continue;
					else if (sval == 1) {
						if (!res)
							asprintf (&res, "%s%s%s", ctx->colors->mod, bitfields[i]->name, ctx->colors->reset);
						else {
							asprintf (&tmp, "%s | %s%s%s", res, ctx->colors->mod, bitfields[i]->name, ctx->colors->reset);
							free(res);
							res = tmp;
						}
						continue;
					}
				}
				char *subval = rnndec_decodeval(ctx, &bitfields[i]->typeinfo, sval, bitfields[i]->high - bitfields[i]->low + 1);
				if (!res)
					asprintf (&res, "%s%s%s = %s", ctx->colors->rname, bitfields[i]->name, ctx->colors->reset, subval);
				else {
					asprintf (&tmp, "%s | %s%s%s = %s", res, ctx->colors->rname, bitfields[i]->name, ctx->colors->reset, subval);
					free(res);
					res = tmp;
				}
				free(subval);
			}
			if (value & ~mask) {
				if (!res)
					asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->err, value & ~mask, ctx->colors->reset);
				else {
					asprintf (&tmp, "%s | %s%#"PRIx64"%s", res, ctx->colors->err, value & ~mask, ctx->colors->reset);
					free(res);
					res = tmp;
				}
			}
			if (!res)
				asprintf (&res, "%s0%s", ctx->colors->num, ctx->colors->reset);
			asprintf (&tmp, "{ %s }", res);
			free(res);
			return tmp;
		case RNN_TTYPE_SPECTYPE:
			return rnndec_decodeval(ctx, &ti->spectype->typeinfo, value, width);
		case RNN_TTYPE_HEX:
			asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->num, value, ctx->colors->reset);
			return res;
		case RNN_TTYPE_FIXED:
			if (value & UINT64_C(1) << (width-1)) {
				asprintf (&res, "%s-%lf%s (%08"PRIx64")", ctx->colors->num,
						((double)((UINT64_C(1) << width) - value)) / ((double)(1 << ti->radix)),
						ctx->colors->reset, value);
				return res;
			}
			/* fallthrough */
		case RNN_TTYPE_UFIXED:
			asprintf (&res, "%s%lf%s (%08"PRIx64")", ctx->colors->num,
					((double)value) / ((double)(1 << ti->radix)),
					ctx->colors->reset, value);
			return res;
		case RNN_TTYPE_UINT:
			asprintf (&res, "%s%"PRIu64"%s", ctx->colors->num, value, ctx->colors->reset);
			return res;
		case RNN_TTYPE_INT:
			if (value & UINT64_C(1) << (width-1))
				asprintf (&res, "%s-%"PRIi64"%s", ctx->colors->num, (UINT64_C(1) << width) - value, ctx->colors->reset);
			else
				asprintf (&res, "%s%"PRIi64"%s", ctx->colors->num, value, ctx->colors->reset);
			return res;
		case RNN_TTYPE_BOOLEAN:
			if (value == 0) {
				asprintf (&res, "%sFALSE%s", ctx->colors->eval, ctx->colors->reset);
				return res;
			} else if (value == 1) {
				asprintf (&res, "%sTRUE%s", ctx->colors->eval, ctx->colors->reset);
				return res;
			}
		case RNN_TTYPE_FLOAT: {
			union { uint64_t i; float f; double d; } val;
			val.i = value;
			if (width == 64)
				asprintf(&res, "%s%f%s", ctx->colors->num,
					val.d, ctx->colors->reset);
			else if (width == 32)
				asprintf(&res, "%s%f%s", ctx->colors->num,
					val.f, ctx->colors->reset);
			else if (width == 16)
				asprintf(&res, "%s%f%s", ctx->colors->num,
					float16(value), ctx->colors->reset);
			else
				goto failhex;

			return res;
		}
		failhex:
		default:
			asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->num, value, ctx->colors->reset);
			return res;
			break;
	}
}